

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O0

void __thiscall Cgmres<Model>::Ax_func(Cgmres<Model> *this,double *Ax,double *dUdt)

{
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double U_buf [75];
  double in_stack_00000410;
  double *in_stack_00000418;
  double *in_stack_00000420;
  double *in_stack_00000428;
  Cgmres<Model> *in_stack_00000430;
  double local_278 [77];
  double *local_10;
  
  local_10 = in_RSI;
  mul(local_278,in_RDX,0.002,0x4b);
  add(local_278,local_278,*(double **)(in_RDI + 0x48),0x4b);
  F_func(in_stack_00000430,in_stack_00000428,in_stack_00000420,in_stack_00000418,in_stack_00000410);
  sub(local_10,local_10,*(double **)(in_RDI + 0x68),0x4b);
  div((int)local_10,(int)local_10);
  return;
}

Assistant:

void Ax_func(double* Ax, const double* dUdt) override {
    double U_buf[len];

    // F(U + dUdt * h, x + dxdt * h, t + h)
    mul(U_buf, dUdt, h, len);
    add(U_buf, U_buf, U, len);
    F_func(Ax, U_buf, x_dxh, t + h);

    // Ax = (F(U + dUdt * h, x + dxdt * h, t + h) - F(U, x + dxdt * h, t + h)) / h
    sub(Ax, Ax, F_dxh_h, len);
    div(Ax, Ax, h, len);
  }